

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O2

int check_matrix(SUNMatrix A,SUNMatrix B,sunrealtype tol)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar3 = SUNDenseMatrix_Data();
  lVar4 = SUNDenseMatrix_Data(B);
  uVar5 = SUNDenseMatrix_LData(A);
  uVar6 = SUNDenseMatrix_LData(B);
  if (uVar5 == uVar6) {
    uVar6 = 0;
    if ((long)uVar5 < 1) {
      uVar5 = uVar6;
    }
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar3 + uVar7 * 8),*(undefined8 *)(lVar4 + uVar7 * 8),
                             tol);
      uVar6 = (ulong)(uint)((int)uVar6 + iVar1);
    }
    uVar2 = (uint)(0 < (int)uVar6);
  }
  else {
    puts(">>> ERROR: check_matrix: Different data array lengths ");
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int check_matrix(SUNMatrix A, SUNMatrix B, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *Adata, *Bdata;
  sunindextype Aldata, Bldata;
  sunindextype i;

  /* get data pointers */
  Adata = SUNDenseMatrix_Data(A);
  Bdata = SUNDenseMatrix_Data(B);

  /* get and check data lengths */
  Aldata = SUNDenseMatrix_LData(A);
  Bldata = SUNDenseMatrix_LData(B);

  if (Aldata != Bldata)
  {
    printf(">>> ERROR: check_matrix: Different data array lengths \n");
    return (1);
  }

  /* compare data */
  for (i = 0; i < Aldata; i++)
  {
    failure += SUNRCompareTol(Adata[i], Bdata[i], tol);
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}